

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::Clear(GeneratedCodeInfo_Annotation *this)

{
  anon_union_56_1_493b367e_for_GeneratedCodeInfo_Annotation_10 aVar1;
  
  RepeatedField<int>::Clear(&(this->field_0)._impl_.path_);
  aVar1 = this->field_0;
  if (((undefined1  [56])aVar1 & (undefined1  [56])0x1) != (undefined1  [56])0x0) {
    internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.source_file_);
  }
  if (((undefined1  [56])aVar1 & (undefined1  [56])0xe) != (undefined1  [56])0x0) {
    (this->field_0)._impl_.semantic_ = 0;
    *(undefined8 *)((long)&this->field_0 + 0x28) = 0;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void GeneratedCodeInfo_Annotation::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.GeneratedCodeInfo.Annotation)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.path_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    _impl_.source_file_.ClearNonDefaultToEmpty();
  }
  if ((cached_has_bits & 0x0000000eu) != 0) {
    ::memset(&_impl_.begin_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.semantic_) -
        reinterpret_cast<char*>(&_impl_.begin_)) + sizeof(_impl_.semantic_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}